

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O0

void PrintReturn(OutputContext *ctx,char *constantData,uint microcodePos)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint size;
  uint offset;
  uint reg;
  uint typeSize;
  uint typeId;
  uint *microcode;
  uint microcodePos_local;
  char *constantData_local;
  OutputContext *ctx_local;
  
  puVar4 = (uint *)(constantData + (ulong)microcodePos * 4);
  _typeSize = puVar4 + 2;
  Print(ctx," (%d, %d) -> (",(ulong)*puVar4,(ulong)puVar4[1]);
  while (*_typeSize != 7) {
    puVar4 = _typeSize + 1;
    switch(*_typeSize) {
    case 2:
      _typeSize = _typeSize + 2;
      Print(ctx,"r%d~",(ulong)*puVar4);
      break;
    case 3:
      _typeSize = _typeSize + 2;
      Print(ctx,"r%d",(ulong)*puVar4);
      break;
    case 4:
      _typeSize = _typeSize + 2;
      Print(ctx,"%d",(ulong)*puVar4);
      break;
    case 5:
      _typeSize = _typeSize + 2;
      Print(ctx,"%dL",(ulong)*puVar4);
      break;
    case 6:
      uVar1 = *puVar4;
      puVar4 = _typeSize + 3;
      uVar2 = _typeSize[2];
      _typeSize = _typeSize + 4;
      uVar3 = *puVar4;
      Print(ctx,"[");
      PrintRegister(ctx,(uchar)uVar1);
      Print(ctx," + 0x%x] x%d",(ulong)uVar2,(ulong)uVar3);
      break;
    default:
      __assert_fail("!\"unknown micro instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                    ,0x11d,"void PrintReturn(OutputContext &, char *, unsigned int)");
    }
    if (*_typeSize != 7) {
      Print(ctx,", ");
    }
  }
  Print(ctx,") @%d",(ulong)(microcodePos << 2));
  return;
}

Assistant:

void PrintReturn(OutputContext &ctx, char *constantData, unsigned microcodePos)
{
	unsigned *microcode = (unsigned*)constantData + microcodePos;

	unsigned typeId = *microcode++;
	unsigned typeSize = *microcode++;

	Print(ctx, " (%d, %d) -> (", typeId, typeSize);

	while(*microcode != rvmiReturn)
	{
		switch(*microcode++)
		{
		case rvmiPush:
			Print(ctx, "r%d~", *microcode++);
			break;
		case rvmiPushQword:
			Print(ctx, "r%d", *microcode++);
			break;
		case rvmiPushImm:
			Print(ctx, "%d", *microcode++);
			break;
		case rvmiPushImmq:
			Print(ctx, "%dL", *microcode++);
			break;
		case rvmiPushMem:
		{
			unsigned reg = *microcode++;
			unsigned offset = *microcode++;
			unsigned size = *microcode++;

			Print(ctx, "[");
			PrintRegister(ctx, (unsigned char)reg);
			Print(ctx, " + 0x%x] x%d", offset, size);
		}
		break;
		default:
			assert(!"unknown micro instruction");
		}

		if(*microcode != rvmiReturn)
			Print(ctx, ", ");
	}

	Print(ctx, ") @%d", microcodePos * 4);
}